

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O3

void __thiscall
QLibraryPrivate::QLibraryPrivate
          (QLibraryPrivate *this,QString *canonicalFileName,QString *version,LoadHints loadHints)

{
  Data *pDVar1;
  QArrayData *data;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (canonicalFileName->d).d;
  (this->fileName).d.d = pDVar1;
  (this->fileName).d.ptr = (canonicalFileName->d).ptr;
  (this->fileName).d.size = (canonicalFileName->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar1 = (version->d).d;
  (this->fullVersion).d.d = pDVar1;
  (this->fullVersion).d.ptr = (version->d).ptr;
  (this->fullVersion).d.size = (version->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->inst).wp.value = (QObject *)0x0;
  (this->metaData).data.n = 0;
  (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  (this->inst).wp.d = (Data *)0x0;
  (this->instanceFactory).super_QBasicAtomicPointer<QObject_*()>._q_value._M_b._M_p =
       (__pointer_type)0x0;
  (this->pHnd).super_QBasicAtomicPointer<void>._q_value._M_b._M_p = (__pointer_type)0x0;
  (this->metaData).data.container = (QCborContainerPrivate *)0x0;
  (this->metaData).data.t = Undefined;
  (this->errorString).d.d = (Data *)0x0;
  (this->errorString).d.ptr = (char16_t *)0x0;
  (this->errorString).d.size = 0;
  (this->qualifiedFileName).d.d = (Data *)0x0;
  (this->qualifiedFileName).d.ptr = (char16_t *)0x0;
  (this->qualifiedFileName).d.size = 0;
  *(undefined8 *)((long)&(this->qualifiedFileName).d.size + 4) = 0;
  this->libraryRefCount = (QAtomicInteger<int>)0x0;
  this->libraryUnloadCount = (QAtomicInteger<int>)0x0;
  this->pluginState = MightBeAPlugin;
  (this->loadHintsInt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (__int_type_conflict)
       loadHints.super_QFlagsStorageHelper<QLibrary::LoadHint,_4>.
       super_QFlagsStorage<QLibrary::LoadHint>.i;
  if ((canonicalFileName->d).size == 0) {
    QMetaObject::tr(&local_58,&QLibrary::staticMetaObject,"The shared library was not found.",
                    (char *)0x0,-1);
    data = &((this->errorString).d.d)->super_QArrayData;
    pcVar2 = (this->errorString).d.ptr;
    (this->errorString).d.d = local_58.d.d;
    (this->errorString).d.ptr = local_58.d.ptr;
    qVar3 = (this->errorString).d.size;
    (this->errorString).d.size = local_58.d.size;
    local_58.d.d = (Data *)data;
    local_58.d.ptr = pcVar2;
    local_58.d.size = qVar3;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QLibraryPrivate::QLibraryPrivate(const QString &canonicalFileName, const QString &version, QLibrary::LoadHints loadHints)
    : fileName(canonicalFileName), fullVersion(version), pluginState(MightBeAPlugin)
{
    loadHintsInt.storeRelaxed(loadHints.toInt());
    if (canonicalFileName.isEmpty())
        errorString = QLibrary::tr("The shared library was not found.");
}